

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JsrtCore.cpp
# Opt level: O1

JsErrorCode
JsVarDeserializer(void *data,size_t size,ReadHostObjectFunc readHostObject,
                 GetSharedArrayBufferFromIdFunc getSharedArrayBufferFromId,void *callbackState,
                 JsVarDeserializerHandle *deserializerHandle)

{
  ScriptContext *pSVar1;
  JsErrorCode JVar2;
  JsrtContext *currentContext;
  HeapAllocator *pHVar3;
  ChakraHostDeserializerHandle *this;
  Deserializer *deserializer;
  undefined1 local_a0 [8];
  TrackAllocData data_1;
  AutoNestedHandledExceptionType __autoNestedHandledExceptionType;
  
  JVar2 = JsErrorNullArgument;
  if ((deserializerHandle != (JsVarDeserializerHandle *)0x0 &&
      getSharedArrayBufferFromId != (GetSharedArrayBufferFromIdFunc)0x0) &&
      (readHostObject != (ReadHostObjectFunc)0x0 && data != (void *)0x0)) {
    currentContext = JsrtContext::GetCurrent();
    JVar2 = CheckContext(currentContext,false,false);
    if (JVar2 == JsNoError) {
      pSVar1 = (((currentContext->javascriptLibrary).ptr)->super_JavascriptLibraryBase).
               scriptContext.ptr;
      AutoNestedHandledExceptionType::AutoNestedHandledExceptionType
                ((AutoNestedHandledExceptionType *)&data_1.line,
                 ExceptionType_StackOverflow|ExceptionType_OutOfMemory);
      local_a0 = (undefined1  [8])&ChakraHostDeserializerHandle::typeinfo;
      data_1.typeinfo = (type_info *)0x0;
      data_1.plusSize = 0xffffffffffffffff;
      data_1.count = (size_t)anon_var_dwarf_6a6a24;
      data_1.filename._0_4_ = 0x192;
      pHVar3 = Memory::HeapAllocator::TrackAllocInfo
                         (&Memory::HeapAllocator::Instance,(TrackAllocData *)local_a0);
      this = (ChakraHostDeserializerHandle *)new<Memory::HeapAllocator>(0x28,pHVar3,0x300d4a);
      (this->super_HostReadStream)._vptr_HostReadStream = (_func_int **)&PTR_ReadHostObject_014e5b58
      ;
      this->m_deserializer = (Deserializer *)0x0;
      this->readHostObject = readHostObject;
      this->getSharedArrayBufferFromId = getSharedArrayBufferFromId;
      this->callbackState = callbackState;
      local_a0 = (undefined1  [8])&Js::SCACore::Deserializer::typeinfo;
      data_1.typeinfo = (type_info *)0x0;
      data_1.plusSize = 0xffffffffffffffff;
      data_1.count = (size_t)anon_var_dwarf_6a6a24;
      data_1.filename._0_4_ = 0x193;
      pHVar3 = Memory::HeapAllocator::TrackAllocInfo
                         (&Memory::HeapAllocator::Instance,(TrackAllocData *)local_a0);
      deserializer = (Deserializer *)new<Memory::HeapAllocator>(0x38,pHVar3,0x300d4a);
      (deserializer->m_streamReader).super_ScriptContextHolder.m_scriptContext = pSVar1;
      (deserializer->m_streamReader).m_stream = (HostReadStream *)this;
      (deserializer->m_streamReader).m_buffer = (byte *)data;
      (deserializer->m_streamReader).m_current = 0;
      (deserializer->m_streamReader).m_length = size;
      deserializer->m_transferableVars = (Var *)0x0;
      deserializer->m_cTransferableVars = 0;
      ChakraHostDeserializerHandle::SetDeserializer(this,deserializer);
      *deserializerHandle = this;
      AutoNestedHandledExceptionType::~AutoNestedHandledExceptionType
                ((AutoNestedHandledExceptionType *)&data_1.line);
      JVar2 = JsNoError;
    }
  }
  return JVar2;
}

Assistant:

CHAKRA_API
JsVarDeserializer(
    _In_ void *data,
    _In_ size_t size,
    _In_ ReadHostObjectFunc readHostObject,
    _In_ GetSharedArrayBufferFromIdFunc getSharedArrayBufferFromId,
    _In_opt_ void* callbackState,
    _Out_ JsVarDeserializerHandle *deserializerHandle)
{
    PARAM_NOT_NULL(data);
    PARAM_NOT_NULL(readHostObject);
    PARAM_NOT_NULL(getSharedArrayBufferFromId);
    PARAM_NOT_NULL(deserializerHandle);
    return ContextAPINoScriptWrapper_NoRecord([&](Js::ScriptContext *scriptContext) -> JsErrorCode {
        ChakraHostDeserializerHandle *reader = HeapNew(ChakraHostDeserializerHandle, readHostObject, getSharedArrayBufferFromId, callbackState);
        reader->SetDeserializer(HeapNew(Js::SCACore::Deserializer, data, size, scriptContext, reader));
        *deserializerHandle = reader;
        return JsNoError;
    });
}